

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_tests.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_158c745::TestBuilder::TestBuilder
          (TestBuilder *this,CScript *script_,string *comment_,uint32_t flags_,bool P2SH,
          WitnessMode wm,int witnessversion,CAmount nValue_)

{
  uint uVar1;
  pointer pcVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  uint uVar3;
  TestBuilder *pTVar4;
  uchar *__last;
  CTransaction *pCVar5;
  pointer pCVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar9;
  CScript *pCVar10;
  CSHA256 *this_01;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar11;
  long in_FS_OFFSET;
  Span<unsigned_char> output;
  span<const_std::byte,_18446744073709551615UL> b;
  span<const_std::byte,_18446744073709551615UL> b_00;
  span<const_std::byte,_18446744073709551615UL> b_01;
  span<const_std::byte,_18446744073709551615UL> b_02;
  uint256 hash_1;
  uint160 hash;
  CScriptWitness local_128;
  undefined1 local_108 [24];
  undefined8 uStack_f0;
  undefined1 local_e8 [24];
  vector<CTxOut,_std::allocator<CTxOut>_> vStack_d0;
  uchar local_b8 [48];
  uint64_t local_88;
  direct_or_indirect local_78;
  uint local_5c;
  vector<CTxIn,_std::allocator<CTxIn>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)this,&script_->super_CScriptBase);
  (this->scriptWitness).stack.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->creditTx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->scriptWitness).stack.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->scriptWitness).stack.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)((long)&(this->witscript).super_CScriptBase._union + 0x10) = 0;
  *(undefined8 *)((long)&(this->witscript).super_CScriptBase._union + 0x18) = 0;
  (this->witscript).super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  *(undefined8 *)((long)&(this->witscript).super_CScriptBase._union + 8) = 0;
  *(undefined8 *)((long)&(this->redeemscript).super_CScriptBase._union + 0x10) = 0;
  *(undefined8 *)((long)&(this->redeemscript).super_CScriptBase._union + 0x18) = 0;
  (this->redeemscript).super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  *(undefined8 *)((long)&(this->redeemscript).super_CScriptBase._union + 8) = 0;
  (this->creditTx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  CMutableTransaction::CMutableTransaction(&this->spendTx);
  this->havePush = false;
  (this->push).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->push).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->push).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->comment)._M_dataplus._M_p = (pointer)&(this->comment).field_2;
  pcVar2 = (comment_->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->comment,pcVar2,pcVar2 + comment_->_M_string_length);
  this->flags = flags_;
  this->scriptError = 0;
  this->nValue = nValue_;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_78.indirect_contents,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)this);
  if (wm == SH) {
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              (&(this->witscript).super_CScriptBase,
               (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_78.indirect_contents);
    local_108._16_8_ = (pointer)0x0;
    uStack_f0 = 0;
    local_108._0_8_ = (CTransaction *)0x0;
    local_108._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    CSHA256::CSHA256((CSHA256 *)local_e8);
    uVar1 = (this->witscript).super_CScriptBase._size;
    uVar3 = uVar1 - 0x1d;
    pCVar10 = (CScript *)(this->witscript).super_CScriptBase._union.indirect_contents.indirect;
    if (uVar1 < 0x1d) {
      uVar3 = uVar1;
      pCVar10 = &this->witscript;
    }
    this_01 = CSHA256::Write((CSHA256 *)local_e8,(uchar *)pCVar10,(ulong)uVar3);
    CSHA256::Finalize(this_01,local_108);
    local_e8._16_8_ = (pointer)0x0;
    vStack_d0.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_e8._0_8_ = (pointer)0x0;
    local_e8._8_8_ = (pointer)0x0;
    pCVar10 = CScript::push_int64((CScript *)local_e8,(ulong)(uint)witnessversion);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_58,local_108,local_e8,
               (allocator_type *)&local_128);
    b_01._M_extent._M_extent_value =
         (long)local_58.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)local_58.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start;
    b_01._M_ptr = (pointer)local_58.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                           super__Vector_impl_data._M_start;
    ppVar9 = &CScript::operator<<(pCVar10,b_01)->super_CScriptBase;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_78.indirect_contents,
               ppVar9);
    pCVar5 = (CTransaction *)
             local_58.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start;
    pCVar6 = local_58.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  }
  else {
    if (wm != PKH) goto LAB_005d8792;
    local_58.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_58.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_58.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)((ulong)local_58.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage & 0xffffffff00000000);
    local_b8[0x20] = '\0';
    local_b8[0x21] = '\0';
    local_b8[0x22] = '\0';
    local_b8[0x23] = '\0';
    local_b8[0x24] = '\0';
    local_b8[0x25] = '\0';
    local_b8[0x26] = '\0';
    local_b8[0x27] = '\0';
    local_b8[0x28] = '\0';
    local_b8[0x29] = '\0';
    local_b8[0x2a] = '\0';
    local_b8[0x2b] = '\0';
    local_b8[0x2c] = '\0';
    local_b8[0x2d] = '\0';
    local_b8[0x2e] = '\0';
    local_b8[0x2f] = '\0';
    local_b8[0x10] = '\0';
    local_b8[0x11] = '\0';
    local_b8[0x12] = '\0';
    local_b8[0x13] = '\0';
    local_b8[0x14] = '\0';
    local_b8[0x15] = '\0';
    local_b8[0x16] = '\0';
    local_b8[0x17] = '\0';
    local_b8[0x18] = '\0';
    local_b8[0x19] = '\0';
    local_b8[0x1a] = '\0';
    local_b8[0x1b] = '\0';
    local_b8[0x1c] = '\0';
    local_b8[0x1d] = '\0';
    local_b8[0x1e] = '\0';
    local_b8[0x1f] = '\0';
    local_b8[0] = '\0';
    local_b8[1] = '\0';
    local_b8[2] = '\0';
    local_b8[3] = '\0';
    local_b8[4] = '\0';
    local_b8[5] = '\0';
    local_b8[6] = '\0';
    local_b8[7] = '\0';
    local_b8[8] = '\0';
    local_b8[9] = '\0';
    local_b8[10] = '\0';
    local_b8[0xb] = '\0';
    local_b8[0xc] = '\0';
    local_b8[0xd] = '\0';
    local_b8[0xe] = '\0';
    local_b8[0xf] = '\0';
    vStack_d0.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    vStack_d0.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_e8._16_4_ = 0;
    local_e8._20_4_ = 0;
    vStack_d0.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_e8._0_8_ = (char *)0x0;
    local_e8._8_4_ = 0;
    local_e8._12_4_ = 0;
    local_88 = 0;
    CSHA256::CSHA256((CSHA256 *)local_e8);
    uVar1 = (this->script).super_CScriptBase._size;
    uVar3 = uVar1 - 0x1d;
    pTVar4 = (TestBuilder *)(this->script).super_CScriptBase._union.indirect_contents.indirect;
    if (uVar1 < 0x1d) {
      uVar3 = uVar1;
      pTVar4 = this;
    }
    CSHA256::Write((CSHA256 *)local_e8,
                   (uchar *)((pTVar4->script).super_CScriptBase._union.direct + 1),(ulong)uVar3 - 1)
    ;
    output.m_size = 0x14;
    output.m_data = (uchar *)&local_58;
    CHash160::Finalize((CHash160 *)local_e8,output);
    local_e8._16_4_ = 0;
    local_e8._20_4_ = 0;
    vStack_d0.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_e8._0_8_ = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)0x0;
    local_e8._8_4_ = 0;
    local_e8._12_4_ = 0;
    local_108[0] = (vector<unsigned_char,std::allocator<unsigned_char>>)0x76;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_e8,(iterator)local_e8,
               local_108);
    ppVar9 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_e8._0_8_;
    uVar1 = vStack_d0.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
            super__Vector_impl_data._M_start._4_4_ - 0x1d;
    if (vStack_d0.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
        super__Vector_impl_data._M_start._4_4_ < 0x1d) {
      ppVar9 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_e8;
      uVar1 = vStack_d0.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
              super__Vector_impl_data._M_start._4_4_;
    }
    local_108[0] = 0xa9;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_e8,
               (uchar *)((long)&ppVar9->_union + (long)(int)uVar1),local_108);
    __last = (uchar *)((long)&local_58.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage + 4);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_108,(uchar *)&local_58,
               __last,(allocator_type *)&local_128);
    b._M_extent._M_extent_value = local_108._8_8_ - local_108._0_8_;
    b._M_ptr = (pointer)local_108._0_8_;
    ppVar9 = &CScript::operator<<((CScript *)local_e8,b)->super_CScriptBase;
    uVar1 = ppVar9->_size;
    uVar3 = uVar1 - 0x1d;
    if (uVar1 < 0x1d) {
      uVar3 = uVar1;
    }
    ppVar11 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
              (ppVar9->_union).indirect_contents.indirect;
    if (uVar1 < 0x1d) {
      ppVar11 = ppVar9;
    }
    local_128.stack.
    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start._0_1_ = (allocator_type)0x88;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
              (ppVar9,(uchar *)((long)&ppVar11->_union + (long)(int)uVar3),(uchar *)&local_128);
    uVar1 = ppVar9->_size;
    uVar3 = uVar1 - 0x1d;
    if (uVar1 < 0x1d) {
      uVar3 = uVar1;
    }
    ppVar11 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
              (ppVar9->_union).indirect_contents.indirect;
    if (uVar1 < 0x1d) {
      ppVar11 = ppVar9;
    }
    local_128.stack.
    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT71(local_128.stack.
                           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._1_7_,0xac);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
              (ppVar9,(uchar *)((long)&ppVar11->_union + (long)(int)uVar3),(uchar *)&local_128);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)this,ppVar9);
    if ((CTransaction *)local_108._0_8_ != (CTransaction *)0x0) {
      operator_delete((void *)local_108._0_8_,local_108._16_8_ - local_108._0_8_);
    }
    if (0x1c < vStack_d0.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start._4_4_) {
      free((void *)local_e8._0_8_);
    }
    local_e8._16_8_ = (pointer)0x0;
    vStack_d0.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_e8._0_8_ = (pointer)0x0;
    local_e8._8_8_ = (pointer)0x0;
    pCVar10 = CScript::push_int64((CScript *)local_e8,(ulong)(uint)witnessversion);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_108,(uchar *)&local_58,
               __last,(allocator_type *)&local_128);
    b_00._M_extent._M_extent_value = local_108._8_8_ - local_108._0_8_;
    b_00._M_ptr = (pointer)local_108._0_8_;
    ppVar9 = &CScript::operator<<(pCVar10,b_00)->super_CScriptBase;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_78.indirect_contents,
               ppVar9);
    pCVar5 = (CTransaction *)local_108._0_8_;
    pCVar6 = (pointer)local_108._16_8_;
  }
  if (pCVar5 != (CTransaction *)0x0) {
    operator_delete(pCVar5,(long)pCVar6 - (long)pCVar5);
  }
  if (0x1c < vStack_d0.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start._4_4_) {
    free((void *)local_e8._0_8_);
  }
LAB_005d8792:
  if (P2SH) {
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              (&(this->redeemscript).super_CScriptBase,
               (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_78.indirect_contents);
    local_e8._16_8_ = (pointer)0x0;
    vStack_d0.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_e8._0_8_ = (pointer)0x0;
    local_e8._8_8_ = (pointer)0x0;
    local_108[0] = 0xa9;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_e8,(iterator)local_e8,
               local_108);
    CScriptID::CScriptID((CScriptID *)&local_58,&this->redeemscript);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_108,(uchar *)&local_58,
               (uchar *)((long)&local_58.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage + 4),
               (allocator_type *)&local_128);
    b_02._M_extent._M_extent_value = local_108._8_8_ - local_108._0_8_;
    b_02._M_ptr = (pointer)local_108._0_8_;
    ppVar9 = &CScript::operator<<((CScript *)local_e8,b_02)->super_CScriptBase;
    uVar1 = ppVar9->_size;
    uVar3 = uVar1 - 0x1d;
    if (uVar1 < 0x1d) {
      uVar3 = uVar1;
    }
    ppVar11 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
              (ppVar9->_union).indirect_contents.indirect;
    if (uVar1 < 0x1d) {
      ppVar11 = ppVar9;
    }
    local_128.stack.
    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT71(local_128.stack.
                           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._1_7_,0x87);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
              (ppVar9,(uchar *)((long)&ppVar11->_union + (long)(int)uVar3),(uchar *)&local_128);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_78.indirect_contents,
               ppVar9);
    if ((CTransaction *)local_108._0_8_ != (CTransaction *)0x0) {
      operator_delete((void *)local_108._0_8_,local_108._16_8_ - local_108._0_8_);
    }
    if (0x1c < vStack_d0.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start._4_4_) {
      free((void *)local_e8._0_8_);
    }
  }
  BuildCreditingTransaction
            ((CMutableTransaction *)local_e8,(CScript *)&local_78.indirect_contents,
             (int)this->nValue);
  local_108._0_8_ = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_108 + 8),
             (CTransaction **)local_108,(allocator<CTransaction> *)&local_58,
             (CMutableTransaction *)local_e8);
  uVar8 = local_108._8_8_;
  uVar7 = local_108._0_8_;
  local_108._0_8_ = (CTransaction *)0x0;
  local_108._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->creditTx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->creditTx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)uVar7;
  (this->creditTx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8;
  if ((this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
     (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00),
     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_ !=
     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_);
  }
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&vStack_d0);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_e8);
  local_108._16_8_ = 0;
  uStack_f0 = 0;
  local_108._0_8_ = (CTransaction *)0x0;
  local_108._8_8_ = 0;
  local_128.stack.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.stack.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.stack.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  BuildSpendingTransaction
            ((CMutableTransaction *)local_e8,(CScript *)local_108,&local_128,
             (this->creditTx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  local_58.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (this->spendTx).vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (this->spendTx).vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_e8._16_8_;
  local_58.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (this->spendTx).vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_58.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (this->spendTx).vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_finish;
  (this->spendTx).vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_e8._0_8_;
  (this->spendTx).vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_e8._8_8_;
  local_e8._0_8_ = (char *)0x0;
  local_e8._8_4_ = 0;
  local_e8._12_4_ = 0;
  local_e8._16_4_ = 0;
  local_e8._20_4_ = 0;
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&local_58);
  local_58.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)(this->spendTx).vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
  (this->spendTx).vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       vStack_d0.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
       ._M_end_of_storage;
  local_58.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)(this->spendTx).vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                      _M_impl.super__Vector_impl_data._M_start;
  local_58.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)(this->spendTx).vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
  (this->spendTx).vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start =
       vStack_d0.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
       ._M_start;
  (this->spendTx).vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_finish =
       vStack_d0.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
       ._M_finish;
  vStack_d0.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  vStack_d0.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  vStack_d0.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)&local_58);
  *(undefined8 *)&(this->spendTx).version = local_b8._0_8_;
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&vStack_d0);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_e8);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector(&local_128.stack);
  if (0x1c < uStack_f0._4_4_) {
    free((void *)local_108._0_8_);
  }
  if (0x1c < local_5c) {
    free(local_78.indirect_contents.indirect);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

TestBuilder(const CScript& script_, const std::string& comment_, uint32_t flags_, bool P2SH = false, WitnessMode wm = WitnessMode::NONE, int witnessversion = 0, CAmount nValue_ = 0) : script(script_), comment(comment_), flags(flags_), nValue(nValue_)
    {
        CScript scriptPubKey = script;
        if (wm == WitnessMode::PKH) {
            uint160 hash;
            CHash160().Write(Span{script}.subspan(1)).Finalize(hash);
            script = CScript() << OP_DUP << OP_HASH160 << ToByteVector(hash) << OP_EQUALVERIFY << OP_CHECKSIG;
            scriptPubKey = CScript() << witnessversion << ToByteVector(hash);
        } else if (wm == WitnessMode::SH) {
            witscript = scriptPubKey;
            uint256 hash;
            CSHA256().Write(witscript.data(), witscript.size()).Finalize(hash.begin());
            scriptPubKey = CScript() << witnessversion << ToByteVector(hash);
        }
        if (P2SH) {
            redeemscript = scriptPubKey;
            scriptPubKey = CScript() << OP_HASH160 << ToByteVector(CScriptID(redeemscript)) << OP_EQUAL;
        }
        creditTx = MakeTransactionRef(BuildCreditingTransaction(scriptPubKey, nValue));
        spendTx = BuildSpendingTransaction(CScript(), CScriptWitness(), *creditTx);
    }